

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.c
# Opt level: O2

int map(thread_pool_t *pool,future_t *future,future_t *from,
       _func_void_ptr_void_ptr_size_t_size_t_ptr *function)

{
  int iVar1;
  undefined8 *__ptr;
  runnable_t *__ptr_00;
  char *__ptr_01;
  size_t sStackY_50;
  
  iVar1 = future_init(future);
  if (iVar1 == -1) {
    __ptr_01 = "map(): future_init() failed as future is NULL.\n";
  }
  else {
    __ptr = (undefined8 *)malloc(0x20);
    if (__ptr != (undefined8 *)0x0) {
      __ptr[1] = function;
      *__ptr = from;
      __ptr[2] = future;
      __ptr[3] = 0;
      __ptr_00 = (runnable_t *)malloc(0x18);
      if (__ptr_00 != (runnable_t *)0x0) {
        __ptr_00->function = map_runnable;
        __ptr_00->arg = __ptr;
        __ptr_00->argsz = 0x20;
        __ptr[3] = __ptr_00;
        iVar1 = defer(pool,*__ptr_00);
        if (iVar1 != 0) {
          fwrite("map(): Submitting new task failed.\n",0x23,1,_stderr);
          free(__ptr);
          free(__ptr_00);
          return -1;
        }
        return 0;
      }
      __ptr_01 = "map(): malloc failed for creating runnable.\n";
      sStackY_50 = 0x2c;
      goto LAB_00102f04;
    }
    __ptr_01 = "map(): malloc failed for creating map_wrapper.\n";
  }
  sStackY_50 = 0x2f;
LAB_00102f04:
  fwrite(__ptr_01,sStackY_50,1,_stderr);
  return -1;
}

Assistant:

int map(thread_pool_t *pool, future_t *future, future_t *from,
        void *(*function)(void *, size_t, size_t *)) {

    if (future_init(future) == -1) {
        err("map(): future_init() failed as future is NULL.\n");
        return -1;
    }

    map_wrap_t *wrapper = malloc(sizeof(map_wrap_t));
    if (wrapper == NULL) {
        err("map(): malloc failed for creating map_wrapper.\n");
        return -1;
    }

    wrapper->func = function;
    wrapper->future_from = from;
    wrapper->new_future = future;
    wrapper->runnable = NULL;

    runnable_t *my_runnable = malloc(sizeof(runnable_t));
    if (my_runnable == NULL) {
        err("map(): malloc failed for creating runnable.\n");
        return -1;
    }

    my_runnable->function = map_runnable;
    my_runnable->arg = wrapper;
    my_runnable->argsz = sizeof(map_wrap_t);

    wrapper->runnable = my_runnable;

    if (defer(pool, *my_runnable) != 0) {
        err("map(): Submitting new task failed.\n");
        free(wrapper);
        free(my_runnable);
        return -1;
    }

    return 0;
}